

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void qcc_arena_done(qcc_arena *arena)

{
  qcc_arena_object *pqVar1;
  
  pqVar1 = arena->objects;
  if (pqVar1 < (qcc_arena_object *)arena->buffer_end) {
    do {
      (*pqVar1->dtor)(pqVar1->ptr);
      pqVar1 = arena->objects + 1;
      arena->objects = pqVar1;
    } while (pqVar1 < (qcc_arena_object *)arena->buffer_end);
  }
  arena->free_memory = arena->buffer_start;
  return;
}

Assistant:

void qcc_arena_done(struct qcc_arena *arena) { qcc_arena_reset(arena); }